

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_update_layer_context_change_config(AV1_COMP *cpi,int64_t target_bandwidth)

{
  int iVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  LAYER_CONTEXT *pLVar4;
  int64_t iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int8_t *piVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int tl;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  double dVar19;
  float local_5c;
  
  pAVar3 = cpi->ppi;
  iVar1 = (cpi->common).mi_params.mi_rows;
  iVar2 = (cpi->common).mi_params.mi_cols;
  local_5c = 1.0;
  iVar16 = 0;
  for (iVar17 = 0; iVar17 < (cpi->svc).number_spatial_layers; iVar17 = iVar17 + 1) {
    uVar7 = (cpi->svc).number_temporal_layers;
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    lVar13 = (long)(int)(uVar7 * iVar17) * 0x3380 + 0x3330;
    iVar14 = uVar7 * iVar17;
    while (iVar8 = iVar14, bVar18 = uVar11 != 0, uVar11 = uVar11 - 1, bVar18) {
      pLVar4 = (cpi->svc).layer_context;
      *(undefined8 *)((long)&(pLVar4->rc).base_frame_target + lVar13) =
           *(undefined8 *)((long)pLVar4 + lVar13 + -0x10);
      lVar13 = lVar13 + 0x3380;
      iVar14 = iVar8 + 1;
      iVar16 = iVar8;
    }
    iVar5 = (cpi->svc).layer_context[iVar16].target_bandwidth;
    for (iVar14 = 0; iVar14 < (int)uVar7; iVar14 = iVar14 + 1) {
      pLVar4 = (cpi->svc).layer_context;
      iVar8 = uVar7 * iVar17 + iVar14;
      pLVar4[iVar8].spatial_layer_target_bandwidth = iVar5;
      lVar13 = pLVar4[iVar8].target_bandwidth;
      if (target_bandwidth != 0) {
        local_5c = (float)lVar13 / (float)target_bandwidth;
      }
      pLVar4[iVar8].p_rc.starting_buffer_level =
           (long)((float)(pAVar3->p_rc).starting_buffer_level * local_5c);
      pLVar4[iVar8].p_rc.optimal_buffer_level =
           (long)((float)(pAVar3->p_rc).optimal_buffer_level * local_5c);
      lVar12 = (long)((float)(pAVar3->p_rc).maximum_buffer_size * local_5c);
      pLVar4[iVar8].p_rc.maximum_buffer_size = lVar12;
      lVar6 = pLVar4[iVar8].p_rc.buffer_level;
      lVar15 = pLVar4[iVar8].p_rc.bits_off_target;
      if (lVar12 <= lVar15) {
        lVar15 = lVar12;
      }
      pLVar4[iVar8].p_rc.bits_off_target = lVar15;
      if (lVar6 < lVar12) {
        lVar12 = lVar6;
      }
      pLVar4[iVar8].p_rc.buffer_level = lVar12;
      dVar19 = cpi->framerate / (double)pLVar4[iVar8].framerate_factor;
      pLVar4[iVar8].framerate = dVar19;
      dVar19 = round((double)lVar13 / dVar19);
      pLVar4[iVar8].rc.avg_frame_bandwidth = (int)dVar19;
      pLVar4[iVar8].rc.max_frame_bandwidth = (cpi->rc).max_frame_bandwidth;
      pLVar4[iVar8].rc.rtc_external_ratectrl = (cpi->rc).rtc_external_ratectrl;
      iVar9 = av1_quantizer_to_qindex(pLVar4[iVar8].max_q);
      pLVar4[iVar8].rc.worst_quality = iVar9;
      iVar9 = av1_quantizer_to_qindex(pLVar4[iVar8].min_q);
      pLVar4[iVar8].rc.best_quality = iVar9;
      if ((cpi->rc).use_external_qp_one_pass != 0) {
        iVar9 = (cpi->rc).best_quality;
        pLVar4[iVar8].rc.worst_quality = (cpi->rc).worst_quality;
        pLVar4[iVar8].rc.best_quality = iVar9;
      }
      iVar9 = (cpi->svc).number_spatial_layers;
      if ((iVar14 == 0 && 1 < iVar9) &&
         ((piVar10 = pLVar4[iVar8].map, piVar10 == (int8_t *)0x0 ||
          ((cpi->svc).prev_number_spatial_layers != iVar9)))) {
        pLVar4[iVar8].sb_index = 0;
        pLVar4[iVar8].actual_num_seg1_blocks = 0;
        pLVar4[iVar8].actual_num_seg2_blocks = 0;
        pLVar4[iVar8].counter_encode_maxq_scene_change = 0;
        aom_free(piVar10);
        piVar10 = (int8_t *)aom_calloc((long)iVar2 * (long)iVar1,1);
        pLVar4[iVar8].map = piVar10;
        if (piVar10 == (int8_t *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate lc->map");
        }
      }
      uVar7 = (cpi->svc).number_temporal_layers;
    }
  }
  return;
}

Assistant:

void av1_update_layer_context_change_config(AV1_COMP *const cpi,
                                            const int64_t target_bandwidth) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  SVC *const svc = &cpi->svc;
  int layer = 0;
  int64_t spatial_layer_target = 0;
  float bitrate_alloc = 1.0;
  const int mi_rows = cm->mi_params.mi_rows;
  const int mi_cols = cm->mi_params.mi_cols;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      svc->layer_context[layer].target_bandwidth = lc->layer_target_bitrate;
    }
    spatial_layer_target = svc->layer_context[layer].target_bandwidth;
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      LAYER_CONTEXT *const lc =
          &svc->layer_context[sl * svc->number_temporal_layers + tl];
      RATE_CONTROL *const lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
      lc->spatial_layer_target_bandwidth = spatial_layer_target;
      if (target_bandwidth != 0) {
        bitrate_alloc = (float)lc->target_bandwidth / target_bandwidth;
      }
      lp_rc->starting_buffer_level =
          (int64_t)(p_rc->starting_buffer_level * bitrate_alloc);
      lp_rc->optimal_buffer_level =
          (int64_t)(p_rc->optimal_buffer_level * bitrate_alloc);
      lp_rc->maximum_buffer_size =
          (int64_t)(p_rc->maximum_buffer_size * bitrate_alloc);
      lp_rc->bits_off_target =
          AOMMIN(lp_rc->bits_off_target, lp_rc->maximum_buffer_size);
      lp_rc->buffer_level =
          AOMMIN(lp_rc->buffer_level, lp_rc->maximum_buffer_size);
      lc->framerate = cpi->framerate / lc->framerate_factor;
      lrc->avg_frame_bandwidth =
          (int)round(lc->target_bandwidth / lc->framerate);
      lrc->max_frame_bandwidth = rc->max_frame_bandwidth;
      lrc->rtc_external_ratectrl = rc->rtc_external_ratectrl;
      lrc->worst_quality = av1_quantizer_to_qindex(lc->max_q);
      lrc->best_quality = av1_quantizer_to_qindex(lc->min_q);
      if (rc->use_external_qp_one_pass) {
        lrc->worst_quality = rc->worst_quality;
        lrc->best_quality = rc->best_quality;
      }
      // Reset the cyclic refresh parameters, if needed (map is NULL),
      // or number of spatial layers has changed.
      // Cyclic refresh is only applied on base temporal layer.
      if (svc->number_spatial_layers > 1 && tl == 0 &&
          (lc->map == NULL ||
           svc->prev_number_spatial_layers != svc->number_spatial_layers)) {
        lc->sb_index = 0;
        lc->actual_num_seg1_blocks = 0;
        lc->actual_num_seg2_blocks = 0;
        lc->counter_encode_maxq_scene_change = 0;
        aom_free(lc->map);
        CHECK_MEM_ERROR(cm, lc->map,
                        aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
      }
    }
  }
}